

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void av1_set_screen_content_options(AV1_COMP *cpi,FeatureFlags *features)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  AV1_COMP *cpi_00;
  long in_RSI;
  long in_RDI;
  bool bVar7;
  uint var;
  buf_2d buf;
  int n_colors;
  uint8_t *this_src;
  int count_buf [256];
  int c;
  int r;
  int64_t counts_2;
  int64_t counts_1;
  uint var_thresh;
  int color_thresh;
  int blk_h;
  int blk_w;
  int bd;
  int64_t area;
  int height;
  int width;
  int stride;
  int use_hbd;
  uint8_t *src;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  undefined1 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb51;
  undefined1 in_stack_fffffffffffffb52;
  undefined1 in_stack_fffffffffffffb53;
  uint in_stack_fffffffffffffb54;
  AV1_COMP *in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb64;
  int in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  int in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  undefined4 in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  int *in_stack_fffffffffffffb88;
  int *in_stack_fffffffffffffb90;
  int local_70;
  int local_6c;
  long local_68;
  long local_60;
  
  if (*(char *)(*(long *)(in_RDI + 0x42008) + 0x38) == '\x02') {
    if (*(int *)(in_RDI + 0x4269c) == 1) {
      *(undefined1 *)(in_RSI + 3) = 1;
      *(bool *)(in_RSI + 4) = *(char *)(in_RDI + 0x42770) != '\x01';
      *(undefined4 *)(in_RDI + 0x9d2fc) = 1;
      *(undefined4 *)(in_RDI + 0x9d2f8) = 1;
    }
    else if (*(char *)(in_RDI + 0x42770) == '\x01') {
      *(undefined1 *)(in_RSI + 4) = 0;
      *(undefined1 *)(in_RSI + 3) = 0;
    }
    else if ((*(int *)(in_RDI + 0x60cb0) == 0) || (*(int *)(in_RDI + 0x60ce0) != 0)) {
      lVar5 = *(long *)(*(long *)(in_RDI + 0x42968) + 0x28);
      uVar1 = *(uint *)(*(long *)(in_RDI + 0x42968) + 0xc0);
      iVar2 = *(int *)(*(long *)(in_RDI + 0x42968) + 0x20);
      iVar3 = **(int **)(in_RDI + 0x42968);
      iVar4 = *(int *)(*(long *)(in_RDI + 0x42968) + 8);
      lVar6 = (long)iVar3 * (long)iVar4;
      local_60 = 0;
      local_68 = 0;
      for (local_6c = 0; local_6c + 0x10 <= iVar4; local_6c = local_6c + 0x10) {
        for (local_70 = 0; local_70 + 0x10 <= iVar3; local_70 = local_70 + 0x10) {
          cpi_00 = (AV1_COMP *)(lVar5 + local_6c * iVar2 + (long)local_70);
          if ((uVar1 & 8) == 0) {
            av1_count_colors((uint8_t *)
                             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                             in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68,
                             in_stack_fffffffffffffb64,(int *)in_stack_fffffffffffffb58,
                             (int *)CONCAT44(in_stack_fffffffffffffb54,
                                             CONCAT13(in_stack_fffffffffffffb53,
                                                      CONCAT12(in_stack_fffffffffffffb52,
                                                               CONCAT11(in_stack_fffffffffffffb51,
                                                                        in_stack_fffffffffffffb50)))
                                            ));
          }
          else {
            av1_count_colors_highbd
                      ((uint8_t *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                       in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68,in_stack_fffffffffffffb64
                       ,in_stack_fffffffffffffb60,(int *)in_stack_fffffffffffffb58,(int *)cpi_00,
                       in_stack_fffffffffffffb88,in_stack_fffffffffffffb90);
          }
          if ((1 < in_stack_fffffffffffffb7c) && (in_stack_fffffffffffffb7c < 5)) {
            local_60 = local_60 + 1;
            in_stack_fffffffffffffb70 = iVar2;
            in_stack_fffffffffffffb54 =
                 av1_get_perpixel_variance
                           (cpi_00,(MACROBLOCKD *)
                                   CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                            (buf_2d *)CONCAT44(in_stack_fffffffffffffb74,iVar2),
                            (BLOCK_SIZE)((uint)in_stack_fffffffffffffb6c >> 0x18),
                            in_stack_fffffffffffffb68,in_stack_fffffffffffffb64);
            in_stack_fffffffffffffb58 = cpi_00;
            if (in_stack_fffffffffffffb54 != 0) {
              local_68 = local_68 + 1;
            }
          }
        }
      }
      *(bool *)(in_RSI + 3) = local_60 * 0xa00 - lVar6 != 0 && lVar6 <= local_60 * 0xa00;
      bVar7 = false;
      if ((*(byte *)(in_RSI + 3) & 1) != 0) {
        bVar7 = local_68 * 0xc00 - lVar6 != 0 && lVar6 <= local_68 * 0xc00;
      }
      *(bool *)(in_RSI + 4) = bVar7;
      *(uint *)(in_RDI + 0x9d2f8) = (uint)(*(byte *)(in_RSI + 3) & 1);
      bVar7 = true;
      if (((*(byte *)(in_RSI + 4) & 1) == 0) &&
         (bVar7 = false, local_60 * 0xa00 + lVar6 * -4 != 0 && lVar6 * 4 <= local_60 * 0xa00)) {
        bVar7 = local_68 * 0x1e00 - lVar6 != 0 && lVar6 <= local_68 * 0x1e00;
      }
      *(uint *)(in_RDI + 0x9d2fc) = (uint)bVar7;
    }
    else {
      *(undefined1 *)(in_RSI + 4) = 0;
      *(undefined1 *)(in_RSI + 3) = 0;
    }
  }
  else {
    bVar7 = *(char *)(*(long *)(in_RDI + 0x42008) + 0x38) != '\0';
    *(bool *)(in_RSI + 4) = bVar7;
    *(bool *)(in_RSI + 3) = bVar7;
  }
  return;
}

Assistant:

void av1_set_screen_content_options(AV1_COMP *cpi, FeatureFlags *features) {
  const AV1_COMMON *const cm = &cpi->common;
  const MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;

  if (cm->seq_params->force_screen_content_tools != 2) {
    features->allow_screen_content_tools = features->allow_intrabc =
        cm->seq_params->force_screen_content_tools;
    return;
  }

  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN) {
    features->allow_screen_content_tools = 1;
    features->allow_intrabc = cpi->oxcf.mode == REALTIME ? 0 : 1;
    cpi->is_screen_content_type = 1;
    cpi->use_screen_content_tools = 1;
    return;
  }

  if (cpi->oxcf.mode == REALTIME) {
    features->allow_screen_content_tools = features->allow_intrabc = 0;
    return;
  }

  // Screen content tools are not evaluated in non-RD encoding mode unless
  // content type is not set explicitly, i.e., when
  // cpi->oxcf.tune_cfg.content != AOM_CONTENT_SCREEN, use_nonrd_pick_mode = 1
  // and hybrid_intra_pickmode = 0. Hence, screen content detection is
  // disabled.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode &&
      !cpi->sf.rt_sf.hybrid_intra_pickmode) {
    features->allow_screen_content_tools = features->allow_intrabc = 0;
    return;
  }

  // Estimate if the source frame is screen content, based on the portion of
  // blocks that have few luma colors.
  const uint8_t *src = cpi->unfiltered_source->y_buffer;
  assert(src != NULL);
  const int use_hbd = cpi->unfiltered_source->flags & YV12_FLAG_HIGHBITDEPTH;
  const int stride = cpi->unfiltered_source->y_stride;
  const int width = cpi->unfiltered_source->y_width;
  const int height = cpi->unfiltered_source->y_height;
  const int64_t area = (int64_t)width * height;
  const int bd = cm->seq_params->bit_depth;
  const int blk_w = 16;
  const int blk_h = 16;
  // These threshold values are selected experimentally.
  const int color_thresh = 4;
  const unsigned int var_thresh = 0;
  // Counts of blocks with no more than color_thresh colors.
  int64_t counts_1 = 0;
  // Counts of blocks with no more than color_thresh colors and variance larger
  // than var_thresh.
  int64_t counts_2 = 0;

  for (int r = 0; r + blk_h <= height; r += blk_h) {
    for (int c = 0; c + blk_w <= width; c += blk_w) {
      int count_buf[1 << 8];  // Maximum (1 << 8) bins for hbd path.
      const uint8_t *const this_src = src + r * stride + c;
      int n_colors;
      if (use_hbd)
        av1_count_colors_highbd(this_src, stride, blk_w, blk_h, bd, NULL,
                                count_buf, &n_colors, NULL);
      else
        av1_count_colors(this_src, stride, blk_w, blk_h, count_buf, &n_colors);
      if (n_colors > 1 && n_colors <= color_thresh) {
        ++counts_1;
        struct buf_2d buf;
        buf.stride = stride;
        buf.buf = (uint8_t *)this_src;
        const unsigned int var = av1_get_perpixel_variance(
            cpi, xd, &buf, BLOCK_16X16, AOM_PLANE_Y, use_hbd);
        if (var > var_thresh) ++counts_2;
      }
    }
  }

  // The threshold values are selected experimentally.
  features->allow_screen_content_tools = counts_1 * blk_h * blk_w * 10 > area;
  // IntraBC would force loop filters off, so we use more strict rules that also
  // requires that the block has high variance.
  features->allow_intrabc = features->allow_screen_content_tools &&
                            counts_2 * blk_h * blk_w * 12 > area;
  cpi->use_screen_content_tools = features->allow_screen_content_tools;
  cpi->is_screen_content_type =
      features->allow_intrabc || (counts_1 * blk_h * blk_w * 10 > area * 4 &&
                                  counts_2 * blk_h * blk_w * 30 > area);
}